

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledRgba.cpp
# Opt level: O2

void testTiledRgba(string *tempDir)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  _Alloc_hider _Var4;
  _func_int **pp_Var5;
  byte bVar6;
  char cVar7;
  bool ytc;
  bool ytc_00;
  bool ytc_01;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ostream *poVar12;
  LineOrder *pLVar13;
  Box2i *pBVar14;
  ChannelList *pCVar15;
  long lVar16;
  half *phVar17;
  int tileY;
  long lVar18;
  int comp;
  Compression comp_00;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 xtc;
  long in_R10;
  char *pcVar22;
  int i;
  long lVar23;
  long lVar24;
  ulong uVar25;
  int tileX;
  uint uVar26;
  half local_16a;
  string fileName;
  Header header;
  long local_f0;
  TiledRgbaOutputFile out;
  Array2D<Imf_2_5::Rgba> p1;
  half local_92;
  half local_90;
  half local_8e;
  half local_8c;
  half local_8a;
  half local_88;
  half local_86;
  half local_84;
  half local_82;
  Array2D<half> p2_2;
  Array2D<half> p1_1;
  
  poVar12 = std::operator<<((ostream *)&std::cout,"Testing the tiled RGBA image interface");
  std::endl<char,std::char_traits<char>>(poVar12);
  bVar6 = IlmThread_2_5::supportsThreads();
  iVar8 = 0;
  while( true ) {
    if (iVar8 == (uint)bVar6 + (uint)bVar6 * 2 + 1) {
      poVar12 = std::operator<<((ostream *)&std::cout,"\nreading multi-layer file");
      std::endl<char,std::char_traits<char>>(poVar12);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                     tempDir,"imf_test_tiled_multi_layer_rgba.exr");
      p1_1._sizeX = 0x77;
      p1_1._sizeY = 0xed;
      p1_1._data = (half *)operator_new__(0xdc56);
      p2_2._sizeX = 0x77;
      p2_2._sizeY = 0xed;
      p2_2._data = (half *)operator_new__(0xdc56);
      lVar23 = 0;
      uVar19 = 0;
      while( true ) {
        uVar25 = (uVar19 & 0xffffffff) % 0x1d;
        uVar21 = (uVar19 & 0xffffffff) % 0x17;
        if (uVar19 == 0x77) break;
        uVar20 = 0;
        lVar18 = 0;
        while( true ) {
          if (lVar18 == 0x1da) break;
          half::half((half *)&header,(float)((int)uVar21 + (int)(uVar20 / 0x11) * -0x11));
          *(undefined2 *)((long)&(p1_1._data)->_h + lVar18 + p1_1._sizeY * lVar23) =
               header._map._M_t._M_impl._0_2_;
          half::half((half *)&header,(float)((int)uVar25 + (int)(uVar20 / 0x13) * -0x13));
          *(undefined2 *)((long)&(p2_2._data)->_h + lVar18 + p2_2._sizeY * lVar23) =
               header._map._M_t._M_impl._0_2_;
          lVar18 = lVar18 + 2;
          uVar25 = (ulong)((int)uVar25 + 1);
          uVar20 = (ulong)((int)uVar20 + 1);
          uVar21 = (ulong)((int)uVar21 + 1);
        }
        uVar19 = uVar19 + 1;
        lVar23 = lVar23 + 2;
      }
      fileName._M_dataplus._M_p = (pointer)0x0;
      Imf_2_5::Header::Header
                (&header,0xed,0x77,1.0,(V2f *)&fileName,1.0,INCREASING_Y,ZIP_COMPRESSION);
      fileName._M_dataplus._M_p = (pointer)0x2000000020;
      fileName._M_string_length = 0;
      Imf_2_5::Header::setTileDescription(&header,(TileDescription *)&fileName);
      pCVar15 = Imf_2_5::Header::channels(&header);
      Imf_2_5::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar15,"R",(Channel *)&fileName);
      pCVar15 = Imf_2_5::Header::channels(&header);
      Imf_2_5::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar15,"foo.R",(Channel *)&fileName);
      p1._sizeY = p1._sizeY & 0xffffffff00000000;
      p1._data = (Rgba *)0x0;
      Imf_2_5::Slice::Slice
                ((Slice *)&fileName,HALF,(char *)p1_1._data,2,0x1da,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&p1 + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&p1,"R",(Slice *)&fileName);
      Imf_2_5::Slice::Slice
                ((Slice *)&fileName,HALF,(char *)p2_2._data,2,0x1da,1,1,0.0,SUB81(in_R10,0),ytc);
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&p1,"foo.R",(Slice *)&fileName);
      pp_Var5 = out._vptr_TiledRgbaOutputFile;
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile
                ((TiledOutputFile *)&fileName,(char *)pp_Var5,&header,iVar8);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&fileName,(FrameBuffer *)&p1);
      iVar8 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&fileName,0);
      iVar9 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&fileName,0);
      Imf_2_5::TiledOutputFile::writeTiles((TiledOutputFile *)&fileName,0,iVar8 + -1,0,iVar9 + -1,0)
      ;
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fileName);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&p1);
      Imf_2_5::Header::~Header(&header);
      pp_Var5 = out._vptr_TiledRgbaOutputFile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileName,"",(allocator<char> *)&p1);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
                ((TiledRgbaInputFile *)&header,(char *)pp_Var5,&fileName,iVar8);
      std::__cxx11::string::~string((string *)&fileName);
      fileName._M_dataplus._M_p = (pointer)0x77;
      fileName._M_string_length = 0xed;
      fileName.field_2._M_allocated_capacity = (size_type)operator_new__(0x37158);
      Imf_2_5::TiledRgbaInputFile::setFrameBuffer
                ((TiledRgbaInputFile *)&header,(Rgba *)fileName.field_2._M_allocated_capacity,1,0xed
                );
      iVar8 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
      iVar9 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
      Imf_2_5::TiledRgbaInputFile::readTiles
                ((TiledRgbaInputFile *)&header,0,iVar8 + -1,0,iVar9 + -1,0);
      lVar23 = fileName.field_2._M_allocated_capacity + 6;
      lVar18 = 0;
      phVar17 = p1_1._data;
      do {
        if (lVar18 == 0x77) {
          Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D((Array2D<Imf_2_5::Rgba> *)&fileName);
          Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
          pp_Var5 = out._vptr_TiledRgbaOutputFile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fileName,"foo",(allocator<char> *)&p1);
          iVar8 = Imf_2_5::globalThreadCount();
          Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
                    ((TiledRgbaInputFile *)&header,(char *)pp_Var5,&fileName,iVar8);
          std::__cxx11::string::~string((string *)&fileName);
          fileName._M_dataplus._M_p = (pointer)0x77;
          fileName._M_string_length = 0xed;
          fileName.field_2._M_allocated_capacity = (size_type)operator_new__(0x37158);
          Imf_2_5::TiledRgbaInputFile::setFrameBuffer
                    ((TiledRgbaInputFile *)&header,(Rgba *)fileName.field_2._M_allocated_capacity,1,
                     0xed);
          iVar8 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
          iVar9 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
          Imf_2_5::TiledRgbaInputFile::readTiles
                    ((TiledRgbaInputFile *)&header,0,iVar8 + -1,0,iVar9 + -1,0);
          lVar23 = fileName.field_2._M_allocated_capacity + 6;
          lVar18 = 0;
          phVar17 = p2_2._data;
          do {
            if (lVar18 == 0x77) {
              Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D((Array2D<Imf_2_5::Rgba> *)&fileName);
              Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
              pp_Var5 = out._vptr_TiledRgbaOutputFile;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fileName,"",(allocator<char> *)&p1);
              iVar8 = Imf_2_5::globalThreadCount();
              Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
                        ((TiledRgbaInputFile *)&header,(char *)pp_Var5,&fileName,iVar8);
              std::__cxx11::string::~string((string *)&fileName);
              p1._sizeX = 0x77;
              p1._sizeY = 0xed;
              p1._data = (Rgba *)operator_new__(0x37158);
              Imf_2_5::TiledRgbaInputFile::setFrameBuffer
                        ((TiledRgbaInputFile *)&header,p1._data,1,0xed);
              iVar8 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
              iVar9 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
              Imf_2_5::TiledRgbaInputFile::readTiles
                        ((TiledRgbaInputFile *)&header,0,iVar8 + -1,0,iVar9 / 2 + -1,0);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fileName,"foo",(allocator<char> *)&local_16a);
              Imf_2_5::TiledRgbaInputFile::setLayerName((TiledRgbaInputFile *)&header,&fileName);
              std::__cxx11::string::~string((string *)&fileName);
              Imf_2_5::TiledRgbaInputFile::setFrameBuffer
                        ((TiledRgbaInputFile *)&header,p1._data,1,0xed);
              iVar8 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
              iVar9 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
              iVar10 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
              Imf_2_5::TiledRgbaInputFile::readTiles
                        ((TiledRgbaInputFile *)&header,0,iVar8 + -1,iVar9 / 2,iVar10 + -1,0);
              local_f0 = 0;
              lVar23 = 0;
              lVar18 = 0;
              do {
                xtc = (undefined1)in_R10;
                if (lVar18 == 0x77) {
                  Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D(&p1);
                  Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
                  fileName._M_dataplus._M_p = (pointer)0x0;
                  Imf_2_5::Header::Header
                            (&header,0xed,0x77,1.0,(V2f *)&fileName,1.0,INCREASING_Y,ZIP_COMPRESSION
                            );
                  fileName._M_dataplus._M_p = (pointer)0x2000000020;
                  fileName._M_string_length = 0;
                  Imf_2_5::Header::setTileDescription(&header,(TileDescription *)&fileName);
                  pCVar15 = Imf_2_5::Header::channels(&header);
                  Imf_2_5::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
                  Imf_2_5::ChannelList::insert(pCVar15,"Y",(Channel *)&fileName);
                  pCVar15 = Imf_2_5::Header::channels(&header);
                  Imf_2_5::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
                  Imf_2_5::ChannelList::insert(pCVar15,"foo.Y",(Channel *)&fileName);
                  p1._sizeY = p1._sizeY & 0xffffffff00000000;
                  p1._data = (Rgba *)0x0;
                  Imf_2_5::Slice::Slice
                            ((Slice *)&fileName,HALF,(char *)p1_1._data,2,0x1da,1,1,0.0,(bool)xtc,
                             ytc_00);
                  Imf_2_5::FrameBuffer::insert((FrameBuffer *)&p1,"Y",(Slice *)&fileName);
                  Imf_2_5::Slice::Slice
                            ((Slice *)&fileName,HALF,(char *)p2_2._data,2,0x1da,1,1,0.0,(bool)xtc,
                             ytc_01);
                  Imf_2_5::FrameBuffer::insert((FrameBuffer *)&p1,"foo.Y",(Slice *)&fileName);
                  pp_Var5 = out._vptr_TiledRgbaOutputFile;
                  iVar8 = Imf_2_5::globalThreadCount();
                  Imf_2_5::TiledOutputFile::TiledOutputFile
                            ((TiledOutputFile *)&fileName,(char *)pp_Var5,&header,iVar8);
                  Imf_2_5::TiledOutputFile::setFrameBuffer
                            ((TiledOutputFile *)&fileName,(FrameBuffer *)&p1);
                  iVar8 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&fileName,0);
                  iVar9 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&fileName,0);
                  Imf_2_5::TiledOutputFile::writeTiles
                            ((TiledOutputFile *)&fileName,0,iVar8 + -1,0,iVar9 + -1,0);
                  Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fileName);
                  std::
                  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                               *)&p1);
                  Imf_2_5::Header::~Header(&header);
                  pp_Var5 = out._vptr_TiledRgbaOutputFile;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&fileName,"",(allocator<char> *)&p1);
                  iVar8 = Imf_2_5::globalThreadCount();
                  Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
                            ((TiledRgbaInputFile *)&header,(char *)pp_Var5,&fileName,iVar8);
                  std::__cxx11::string::~string((string *)&fileName);
                  fileName._M_dataplus._M_p = (pointer)0x77;
                  fileName._M_string_length = 0xed;
                  fileName.field_2._M_allocated_capacity = (size_type)operator_new__(0x37158);
                  Imf_2_5::TiledRgbaInputFile::setFrameBuffer
                            ((TiledRgbaInputFile *)&header,
                             (Rgba *)fileName.field_2._M_allocated_capacity,1,0xed);
                  iVar8 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
                  iVar9 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
                  Imf_2_5::TiledRgbaInputFile::readTiles
                            ((TiledRgbaInputFile *)&header,0,iVar8 + -1,0,iVar9 + -1,0);
                  lVar23 = fileName.field_2._M_allocated_capacity + 6;
                  lVar18 = 0;
                  phVar17 = p1_1._data;
                  do {
                    if (lVar18 == 0x77) {
                      Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D((Array2D<Imf_2_5::Rgba> *)&fileName)
                      ;
                      Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile
                                ((TiledRgbaInputFile *)&header);
                      pp_Var5 = out._vptr_TiledRgbaOutputFile;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&fileName,"foo",(allocator<char> *)&p1);
                      iVar8 = Imf_2_5::globalThreadCount();
                      Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
                                ((TiledRgbaInputFile *)&header,(char *)pp_Var5,&fileName,iVar8);
                      std::__cxx11::string::~string((string *)&fileName);
                      fileName._M_dataplus._M_p = (pointer)0x77;
                      fileName._M_string_length = 0xed;
                      fileName.field_2._M_allocated_capacity = (size_type)operator_new__(0x37158);
                      Imf_2_5::TiledRgbaInputFile::setFrameBuffer
                                ((TiledRgbaInputFile *)&header,
                                 (Rgba *)fileName.field_2._M_allocated_capacity,1,0xed);
                      iVar8 = Imf_2_5::TiledRgbaInputFile::numXTiles
                                        ((TiledRgbaInputFile *)&header,0);
                      iVar9 = Imf_2_5::TiledRgbaInputFile::numYTiles
                                        ((TiledRgbaInputFile *)&header,0);
                      Imf_2_5::TiledRgbaInputFile::readTiles
                                ((TiledRgbaInputFile *)&header,0,iVar8 + -1,0,iVar9 + -1,0);
                      lVar23 = fileName.field_2._M_allocated_capacity + 6;
                      lVar18 = 0;
                      phVar17 = p2_2._data;
                      do {
                        if (lVar18 == 0x77) {
                          Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D
                                    ((Array2D<Imf_2_5::Rgba> *)&fileName);
                          Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile
                                    ((TiledRgbaInputFile *)&header);
                          pp_Var5 = out._vptr_TiledRgbaOutputFile;
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&fileName,"",(allocator<char> *)&p1);
                          iVar8 = Imf_2_5::globalThreadCount();
                          Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
                                    ((TiledRgbaInputFile *)&header,(char *)pp_Var5,&fileName,iVar8);
                          std::__cxx11::string::~string((string *)&fileName);
                          p1._sizeX = 0x77;
                          p1._sizeY = 0xed;
                          p1._data = (Rgba *)operator_new__(0x37158);
                          Imf_2_5::TiledRgbaInputFile::setFrameBuffer
                                    ((TiledRgbaInputFile *)&header,p1._data,1,0xed);
                          iVar8 = Imf_2_5::TiledRgbaInputFile::numXTiles
                                            ((TiledRgbaInputFile *)&header,0);
                          iVar9 = Imf_2_5::TiledRgbaInputFile::numYTiles
                                            ((TiledRgbaInputFile *)&header,0);
                          Imf_2_5::TiledRgbaInputFile::readTiles
                                    ((TiledRgbaInputFile *)&header,0,iVar8 + -1,0,iVar9 / 2 + -1,0);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&fileName,"foo",(allocator<char> *)&local_16a);
                          Imf_2_5::TiledRgbaInputFile::setLayerName
                                    ((TiledRgbaInputFile *)&header,&fileName);
                          std::__cxx11::string::~string((string *)&fileName);
                          Imf_2_5::TiledRgbaInputFile::setFrameBuffer
                                    ((TiledRgbaInputFile *)&header,p1._data,1,0xed);
                          iVar8 = Imf_2_5::TiledRgbaInputFile::numXTiles
                                            ((TiledRgbaInputFile *)&header,0);
                          iVar9 = Imf_2_5::TiledRgbaInputFile::numYTiles
                                            ((TiledRgbaInputFile *)&header,0);
                          iVar10 = Imf_2_5::TiledRgbaInputFile::numYTiles
                                             ((TiledRgbaInputFile *)&header,0);
                          Imf_2_5::TiledRgbaInputFile::readTiles
                                    ((TiledRgbaInputFile *)&header,0,iVar8 + -1,iVar9 / 2,
                                     iVar10 + -1,0);
                          local_f0 = 0;
                          lVar18 = 0;
                          lVar23 = 0;
                          do {
                            if (lVar23 == 0x77) {
                              Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D(&p1);
                              Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile
                                        ((TiledRgbaInputFile *)&header);
                              remove((char *)out._vptr_TiledRgbaOutputFile);
                              Imf_2_5::Array2D<half>::~Array2D(&p2_2);
                              Imf_2_5::Array2D<half>::~Array2D(&p1_1);
                              std::__cxx11::string::~string((string *)&out);
                              poVar12 = std::operator<<((ostream *)&std::cout,"ok\n");
                              std::endl<char,std::char_traits<char>>(poVar12);
                              return;
                            }
                            lVar24 = 1;
                            while (lVar24 != 0x1db) {
                              iVar8 = Imf_2_5::TiledRgbaInputFile::numYTiles
                                                ((TiledRgbaInputFile *)&header,0);
                              uVar26 = Imf_2_5::TiledRgbaInputFile::tileYSize
                                                 ((TiledRgbaInputFile *)&header);
                              lVar16 = p1._sizeY * local_f0;
                              fVar2 = *(float *)((long)&half::_toFloat +
                                                (ulong)*(ushort *)
                                                        ((long)p1._data + lVar24 * 4 + lVar16 + -4)
                                                * 4);
                              if (lVar23 < (int)(uVar26 * (iVar8 / 2))) {
                                fVar3 = *(float *)((long)&half::_toFloat +
                                                  (ulong)*(ushort *)
                                                          ((long)p1_1._data +
                                                          lVar24 + -1 + p1_1._sizeY * lVar18) * 4);
                                if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                  __assert_fail("p3[y][x].r == p1[y][x]",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                                ,0x35c,
                                                "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                               );
                                }
                                fVar2 = *(float *)((long)&half::_toFloat +
                                                  (ulong)*(ushort *)
                                                          ((long)p1._data + lVar24 * 4 + lVar16 + -2
                                                          ) * 4);
                                if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                  __assert_fail("p3[y][x].g == p1[y][x]",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                                ,0x35d,
                                                "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                               );
                                }
                                fVar2 = *(float *)((long)&half::_toFloat +
                                                  (ulong)*(unsigned_short *)
                                                          ((long)&(&(p1._data)->r)[lVar24 * 2]._h +
                                                          lVar16) * 4);
                                if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                  __assert_fail("p3[y][x].b == p1[y][x]",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                                ,0x35e,
                                                "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                               );
                                }
                              }
                              else {
                                fVar3 = *(float *)((long)&half::_toFloat +
                                                  (ulong)*(ushort *)
                                                          ((long)p2_2._data +
                                                          lVar24 + -1 + p2_2._sizeY * lVar18) * 4);
                                if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                  __assert_fail("p3[y][x].r == p2[y][x]",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                                ,0x362,
                                                "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                               );
                                }
                                fVar2 = *(float *)((long)&half::_toFloat +
                                                  (ulong)*(ushort *)
                                                          ((long)p1._data + lVar24 * 4 + lVar16 + -2
                                                          ) * 4);
                                if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                  __assert_fail("p3[y][x].g == p2[y][x]",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                                ,0x363,
                                                "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                               );
                                }
                                fVar2 = *(float *)((long)&half::_toFloat +
                                                  (ulong)*(unsigned_short *)
                                                          ((long)&(&(p1._data)->r)[lVar24 * 2]._h +
                                                          lVar16) * 4);
                                if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                  __assert_fail("p3[y][x].b == p2[y][x]",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                                ,0x364,
                                                "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                               );
                                }
                              }
                              fVar2 = *(float *)((long)&half::_toFloat +
                                                (ulong)*(unsigned_short *)
                                                        ((long)&(&(p1._data)->g)[lVar24 * 2]._h +
                                                        lVar16) * 4);
                              lVar24 = lVar24 + 2;
                              if ((fVar2 != 1.0) || (NAN(fVar2))) {
                                __assert_fail("p3[y][x].a == 1",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                              ,0x367,
                                              "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                             );
                              }
                            }
                            lVar23 = lVar23 + 1;
                            lVar18 = lVar18 + 2;
                            local_f0 = local_f0 + 8;
                          } while( true );
                        }
                        lVar24 = 0;
                        while (lVar24 != 0xed) {
                          fVar2 = *(float *)((long)&half::_toFloat +
                                            (ulong)*(ushort *)(lVar23 + -6 + lVar24 * 8) * 4);
                          fVar3 = *(float *)((long)&half::_toFloat + (ulong)phVar17[lVar24]._h * 4);
                          if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                            __assert_fail("p3[y][x].r == p2[y][x]",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                          ,0x33d,
                                          "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                         );
                          }
                          fVar2 = *(float *)((long)&half::_toFloat +
                                            (ulong)*(ushort *)(lVar23 + -4 + lVar24 * 8) * 4);
                          if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                            __assert_fail("p3[y][x].g == p2[y][x]",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                          ,0x33e,
                                          "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                         );
                          }
                          fVar2 = *(float *)((long)&half::_toFloat +
                                            (ulong)*(ushort *)(lVar23 + -2 + lVar24 * 8) * 4);
                          if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                            __assert_fail("p3[y][x].b == p2[y][x]",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                          ,0x33f,
                                          "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                         );
                          }
                          fVar2 = *(float *)((long)&half::_toFloat +
                                            (ulong)*(ushort *)(lVar23 + lVar24 * 8) * 4);
                          lVar24 = lVar24 + 1;
                          if ((fVar2 != 1.0) || (NAN(fVar2))) {
                            __assert_fail("p3[y][x].a == 1",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                          ,0x340,
                                          "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                         );
                          }
                        }
                        lVar18 = lVar18 + 1;
                        lVar23 = lVar23 + fileName._M_string_length * 8;
                        phVar17 = phVar17 + p2_2._sizeY;
                      } while( true );
                    }
                    lVar24 = 0;
                    while (lVar24 != 0xed) {
                      fVar2 = *(float *)((long)&half::_toFloat +
                                        (ulong)*(ushort *)(lVar23 + -6 + lVar24 * 8) * 4);
                      fVar3 = *(float *)((long)&half::_toFloat + (ulong)phVar17[lVar24]._h * 4);
                      if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                        __assert_fail("p3[y][x].r == p1[y][x]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                      ,0x32a,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                     );
                      }
                      fVar2 = *(float *)((long)&half::_toFloat +
                                        (ulong)*(ushort *)(lVar23 + -4 + lVar24 * 8) * 4);
                      if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                        __assert_fail("p3[y][x].g == p1[y][x]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                      ,0x32b,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                     );
                      }
                      fVar2 = *(float *)((long)&half::_toFloat +
                                        (ulong)*(ushort *)(lVar23 + -2 + lVar24 * 8) * 4);
                      if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                        __assert_fail("p3[y][x].b == p1[y][x]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                      ,0x32c,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                     );
                      }
                      fVar2 = *(float *)((long)&half::_toFloat +
                                        (ulong)*(ushort *)(lVar23 + lVar24 * 8) * 4);
                      lVar24 = lVar24 + 1;
                      if ((fVar2 != 1.0) || (NAN(fVar2))) {
                        __assert_fail("p3[y][x].a == 1",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                      ,0x32d,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                     );
                      }
                    }
                    lVar18 = lVar18 + 1;
                    lVar23 = lVar23 + fileName._M_string_length * 8;
                    phVar17 = phVar17 + p1_1._sizeY;
                  } while( true );
                }
                lVar24 = 0;
                while (lVar24 != 0xed) {
                  iVar8 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
                  uVar26 = Imf_2_5::TiledRgbaInputFile::tileYSize((TiledRgbaInputFile *)&header);
                  lVar16 = p1._sizeY * local_f0;
                  fVar2 = *(float *)((long)&half::_toFloat +
                                    (ulong)*(unsigned_short *)
                                            ((long)&p1._data[lVar24].r._h + lVar16) * 4);
                  if (lVar18 < (int)(uVar26 * (iVar8 / 2))) {
                    pfVar1 = (float *)((long)&half::_toFloat +
                                      (ulong)*(unsigned_short *)
                                              ((long)&p1_1._data[lVar24]._h + p1_1._sizeY * lVar23)
                                      * 4);
                    if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                      __assert_fail("p3[y][x].r == p1[y][x]",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                    ,0x2fb,
                                    "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                   );
                    }
                  }
                  else {
                    pfVar1 = (float *)((long)&half::_toFloat +
                                      (ulong)*(unsigned_short *)
                                              ((long)&p2_2._data[lVar24]._h + p2_2._sizeY * lVar23)
                                      * 4);
                    if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                      __assert_fail("p3[y][x].r == p2[y][x]",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                    ,0x2fd,
                                    "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                   );
                    }
                  }
                  fVar2 = *(float *)((long)&half::_toFloat +
                                    (ulong)*(unsigned_short *)
                                            ((long)&p1._data[lVar24].g._h + lVar16) * 4);
                  if ((fVar2 != 0.0) || (NAN(fVar2))) {
                    __assert_fail("p3[y][x].g == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                  ,0x2ff,
                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                 );
                  }
                  fVar2 = *(float *)((long)&half::_toFloat +
                                    (ulong)*(unsigned_short *)
                                            ((long)&p1._data[lVar24].b._h + lVar16) * 4);
                  if ((fVar2 != 0.0) || (NAN(fVar2))) {
                    __assert_fail("p3[y][x].b == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                  ,0x300,
                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                 );
                  }
                  fVar2 = *(float *)((long)&half::_toFloat +
                                    (ulong)*(unsigned_short *)
                                            ((long)&p1._data[lVar24].a._h + lVar16) * 4);
                  lVar24 = lVar24 + 1;
                  if ((fVar2 != 1.0) || (NAN(fVar2))) {
                    __assert_fail("p3[y][x].a == 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                  ,0x301,
                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                 );
                  }
                }
                lVar18 = lVar18 + 1;
                lVar23 = lVar23 + 2;
                local_f0 = local_f0 + 8;
              } while( true );
            }
            lVar24 = 0;
            while (lVar24 != 0xed) {
              fVar2 = *(float *)((long)&half::_toFloat +
                                (ulong)*(ushort *)(lVar23 + -6 + lVar24 * 8) * 4);
              pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar17[lVar24]._h * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                __assert_fail("p3[y][x].r == p2[y][x]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                              ,0x2dd,
                              "void (anonymous namespace)::writeReadLayers(const std::string &)");
              }
              fVar2 = *(float *)((long)&half::_toFloat +
                                (ulong)*(ushort *)(lVar23 + -4 + lVar24 * 8) * 4);
              if ((fVar2 != 0.0) || (NAN(fVar2))) {
                __assert_fail("p3[y][x].g == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                              ,0x2de,
                              "void (anonymous namespace)::writeReadLayers(const std::string &)");
              }
              fVar2 = *(float *)((long)&half::_toFloat +
                                (ulong)*(ushort *)(lVar23 + -2 + lVar24 * 8) * 4);
              if ((fVar2 != 0.0) || (NAN(fVar2))) {
                __assert_fail("p3[y][x].b == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                              ,0x2df,
                              "void (anonymous namespace)::writeReadLayers(const std::string &)");
              }
              fVar2 = *(float *)((long)&half::_toFloat + (ulong)*(ushort *)(lVar23 + lVar24 * 8) * 4
                                );
              lVar24 = lVar24 + 1;
              if ((fVar2 != 1.0) || (NAN(fVar2))) {
                __assert_fail("p3[y][x].a == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                              ,0x2e0,
                              "void (anonymous namespace)::writeReadLayers(const std::string &)");
              }
            }
            lVar18 = lVar18 + 1;
            lVar23 = lVar23 + fileName._M_string_length * 8;
            phVar17 = phVar17 + p2_2._sizeY;
          } while( true );
        }
        lVar24 = 0;
        while (lVar24 != 0xed) {
          fVar2 = *(float *)((long)&half::_toFloat +
                            (ulong)*(ushort *)(lVar23 + -6 + lVar24 * 8) * 4);
          pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar17[lVar24]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p3[y][x].r == p1[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2ca,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar2 = *(float *)((long)&half::_toFloat +
                            (ulong)*(ushort *)(lVar23 + -4 + lVar24 * 8) * 4);
          if ((fVar2 != 0.0) || (NAN(fVar2))) {
            __assert_fail("p3[y][x].g == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2cb,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar2 = *(float *)((long)&half::_toFloat +
                            (ulong)*(ushort *)(lVar23 + -2 + lVar24 * 8) * 4);
          if ((fVar2 != 0.0) || (NAN(fVar2))) {
            __assert_fail("p3[y][x].b == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2cc,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar2 = *(float *)((long)&half::_toFloat + (ulong)*(ushort *)(lVar23 + lVar24 * 8) * 4);
          lVar24 = lVar24 + 1;
          if ((fVar2 != 1.0) || (NAN(fVar2))) {
            __assert_fail("p3[y][x].a == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2cd,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
        }
        lVar18 = lVar18 + 1;
        lVar23 = lVar23 + fileName._M_string_length * 8;
        phVar17 = phVar17 + p1_1._sizeY;
      } while( true );
    }
    cVar7 = IlmThread_2_5::supportsThreads();
    if (cVar7 != '\0') {
      Imf_2_5::setGlobalThreadCount(iVar8);
      poVar12 = std::operator<<((ostream *)&std::cout,"\nnumber of threads: ");
      iVar9 = Imf_2_5::globalThreadCount();
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar9);
      std::endl<char,std::char_traits<char>>(poVar12);
    }
    for (lVar23 = 0; lVar23 != 4; lVar23 = lVar23 + 1) {
      poVar12 = std::operator<<((ostream *)&std::cout,"\nImage size = ");
      iVar9 = (&DAT_001f0710)[lVar23];
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar9);
      poVar12 = std::operator<<(poVar12," x ");
      iVar10 = (&DAT_001f0720)[lVar23];
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar10);
      std::endl<char,std::char_traits<char>>(poVar12);
      for (comp_00 = NO_COMPRESSION; (int)comp_00 < 10; comp_00 = comp_00 + RLE_COMPRESSION) {
        if (comp_00 == ZIP_COMPRESSION) {
          comp_00 = PIZ_COMPRESSION;
        }
        if (lVar23 == 0) {
          anon_unknown.dwarf_26ff00::writeRead(tempDir,iVar9,iVar10,comp_00,1,1);
        }
        anon_unknown.dwarf_26ff00::writeRead(tempDir,iVar9,iVar10,comp_00,0x23,0x1a);
        anon_unknown.dwarf_26ff00::writeRead(tempDir,iVar9,iVar10,comp_00,0x4b,0x34);
        anon_unknown.dwarf_26ff00::writeRead(tempDir,iVar9,iVar10,comp_00,0x108,0x81);
      }
    }
    poVar12 = std::operator<<((ostream *)&std::cout,"\nfile with missing and broken tiles");
    std::endl<char,std::char_traits<char>>(poVar12);
    std::operator+(&fileName,tempDir,"imf_test_tiled_incomplete.exr");
    p1._sizeX = 300;
    p1._sizeY = 400;
    p1._data = (Rgba *)operator_new__(960000);
    lVar23 = 0;
    for (uVar19 = 0; uVar19 != 300; uVar19 = uVar19 + 1) {
      uVar26 = 0;
      lVar18 = 0;
      while( true ) {
        if (lVar18 == 0xc80) break;
        half::half((half *)&p1_1,(float)(int)(short)((uVar26 & 0xffff) % 5));
        half::half((half *)&p2_2,(float)(int)(short)((uVar26 & 0xffff) % 0x11));
        half::half(&local_16a,(float)(int)((uVar19 & 0xffffffff) % 0x17));
        half::half(&local_82,(float)(int)((uVar19 & 0xffffffff) % 0x1d));
        *(ulong *)((long)&((p1._data)->r)._h + lVar18 + p1._sizeY * lVar23) =
             CONCAT26(local_82._h,
                      CONCAT24(local_16a._h,
                               CONCAT22((undefined2)p2_2._sizeX,(undefined2)p1_1._sizeX)));
        lVar18 = lVar18 + 8;
        uVar26 = uVar26 + 1;
      }
      lVar23 = lVar23 + 8;
    }
    poVar12 = std::operator<<((ostream *)&std::cout,"writing");
    std::endl<char,std::char_traits<char>>(poVar12);
    remove(fileName._M_dataplus._M_p);
    out._vptr_TiledRgbaOutputFile = (_func_int **)0x0;
    Imf_2_5::Header::Header(&header,400,300,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
    pLVar13 = Imf_2_5::Header::lineOrder(&header);
    _Var4 = fileName._M_dataplus;
    *pLVar13 = RANDOM_Y;
    iVar9 = Imf_2_5::globalThreadCount();
    Imf_2_5::TiledRgbaOutputFile::TiledRgbaOutputFile
              (&out,_Var4._M_p,&header,WRITE_RGBA,0x1e,0x28,ONE_LEVEL,ROUND_DOWN,iVar9);
    Imf_2_5::TiledRgbaOutputFile::setFrameBuffer(&out,p1._data,1,400);
    Imf_2_5::TiledRgbaOutputFile::writeTile(&out,0,0,0);
    for (iVar9 = 0; iVar10 = Imf_2_5::TiledRgbaOutputFile::numYTiles(&out,0), iVar9 < iVar10;
        iVar9 = iVar9 + 1) {
      for (iVar10 = 0; iVar11 = Imf_2_5::TiledRgbaOutputFile::numXTiles(&out,0), iVar10 < iVar11;
          iVar10 = iVar10 + 1) {
        if ((iVar9 + iVar10 & 1U) != 0) {
          Imf_2_5::TiledRgbaOutputFile::writeTile(&out,iVar10,iVar9,0);
        }
      }
    }
    Imf_2_5::TiledRgbaOutputFile::writeTile(&out,2,0,0);
    Imf_2_5::TiledRgbaOutputFile::breakTile(&out,0,0,0,0,0x19,10,-1);
    Imf_2_5::TiledRgbaOutputFile::breakTile(&out,2,0,0,0,0x19,10,-1);
    Imf_2_5::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
    Imf_2_5::Header::~Header(&header);
    out._vptr_TiledRgbaOutputFile = (_func_int **)0x12c;
    out._outputFile = (TiledOutputFile *)0x190;
    out._toYa = (ToYa *)operator_new__(960000);
    lVar23 = 0;
    for (lVar18 = 0; lVar18 != 300; lVar18 = lVar18 + 1) {
      for (lVar24 = 0; lVar24 != 400; lVar24 = lVar24 + 1) {
        half::half(&local_84,-1.0);
        half::half(&local_86,-1.0);
        half::half(&local_88,-1.0);
        half::half(&local_8a,-1.0);
        *(ulong *)((long)&((out._toYa)->super_Mutex).super___mutex_base._M_mutex +
                  lVar24 * 8 + (long)out._outputFile * lVar23) =
             CONCAT26(local_8a._h,CONCAT24(local_88._h,CONCAT22(local_86._h,local_84._h)));
      }
      lVar23 = lVar23 + 8;
    }
    std::operator<<((ostream *)&std::cout,"reading one tile at a time,");
    std::ostream::flush();
    _Var4 = fileName._M_dataplus;
    iVar9 = Imf_2_5::globalThreadCount();
    Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&header,_Var4._M_p,iVar9);
    pBVar14 = Imf_2_5::TiledRgbaInputFile::dataWindow((TiledRgbaInputFile *)&header);
    iVar9 = (pBVar14->min).x;
    if ((pBVar14->max).x - iVar9 != 399) {
      __assert_fail("dw.max.x - dw.min.x + 1 == width",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x217,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    iVar10 = (pBVar14->min).y;
    if ((pBVar14->max).y - iVar10 != 299) {
      __assert_fail("dw.max.y - dw.min.y + 1 == height",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x218,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (iVar9 != 0) {
      __assert_fail("dw.min.x == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x219,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (iVar10 != 0) {
      __assert_fail("dw.min.y == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x21a,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    Imf_2_5::TiledRgbaInputFile::setFrameBuffer
              ((TiledRgbaInputFile *)&header,(Rgba *)out._toYa,1,400);
    iVar9 = 0;
    while( true ) {
      iVar10 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
      if (iVar10 <= iVar9) break;
      iVar10 = 0;
      while( true ) {
        iVar11 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
        if (iVar11 <= iVar10) break;
        Imf_2_5::TiledRgbaInputFile::readTile((TiledRgbaInputFile *)&header,iVar10,iVar9,0);
        if ((iVar9 + iVar10 & 1U) != 1) {
          __assert_fail("tileBroken || (tilePresent == ((tileX + tileY) & 1))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                        ,0x232,
                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
        }
        iVar10 = iVar10 + 1;
      }
      iVar9 = iVar9 + 1;
    }
    poVar12 = std::operator<<((ostream *)&std::cout," comparing");
    std::endl<char,std::char_traits<char>>(poVar12);
    std::ostream::flush();
    pcVar22 = ((out._toYa)->super_Mutex).super___mutex_base._M_mutex.__size + 6;
    in_R10 = (long)out._outputFile * 8;
    phVar17 = &(p1._data)->a;
    for (lVar23 = 0; lVar23 != 300; lVar23 = lVar23 + 1) {
      for (lVar18 = 0; lVar18 != 400; lVar18 = lVar18 + 1) {
        fVar2 = *(float *)((long)&half::_toFloat + (ulong)*(ushort *)(pcVar22 + lVar18 * 8 + -6) * 4
                          );
        if (((ushort)lVar18 / 0x1e + (ushort)lVar23 / 0x28 & 1) == 0) {
          if ((((fVar2 != -1.0) || (NAN(fVar2))) ||
              (fVar2 = *(float *)((long)&half::_toFloat +
                                 (ulong)*(ushort *)(pcVar22 + lVar18 * 8 + -4) * 4), fVar2 != -1.0))
             || (((NAN(fVar2) ||
                  (fVar2 = *(float *)((long)&half::_toFloat +
                                     (ulong)*(ushort *)(pcVar22 + lVar18 * 8 + -2) * 4),
                  fVar2 != -1.0)) ||
                 ((NAN(fVar2) ||
                  ((fVar2 = *(float *)((long)&half::_toFloat +
                                      (ulong)*(ushort *)(pcVar22 + lVar18 * 8) * 4), fVar2 != -1.0
                   || (NAN(fVar2))))))))) {
            __assert_fail("t.r == -1 && t.g == -1 && t.b == -1 && t.a == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x24f,
                          "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
          }
        }
        else {
          pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar17[lVar18 * 4 + -3]._h * 4);
          if (((((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) ||
               (fVar2 = *(float *)((long)&half::_toFloat +
                                  (ulong)*(ushort *)(pcVar22 + lVar18 * 8 + -4) * 4),
               pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar17[lVar18 * 4 + -2]._h * 4),
               fVar2 != *pfVar1)) ||
              ((NAN(fVar2) || NAN(*pfVar1) ||
               (fVar2 = *(float *)((long)&half::_toFloat +
                                  (ulong)*(ushort *)(pcVar22 + lVar18 * 8 + -2) * 4),
               pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar17[lVar18 * 4 + -1]._h * 4),
               fVar2 != *pfVar1)))) ||
             ((NAN(fVar2) || NAN(*pfVar1) ||
              ((fVar2 = *(float *)((long)&half::_toFloat +
                                  (ulong)*(ushort *)(pcVar22 + lVar18 * 8) * 4),
               pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar17[lVar18 * 4]._h * 4),
               fVar2 != *pfVar1 || (NAN(fVar2) || NAN(*pfVar1))))))) {
            __assert_fail("t.r == s.r && t.g == s.g && t.b == s.b && t.a == s.a",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x248,
                          "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
          }
        }
      }
      pcVar22 = pcVar22 + in_R10;
      phVar17 = phVar17 + p1._sizeY * 4;
    }
    Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
    Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D((Array2D<Imf_2_5::Rgba> *)&out);
    out._vptr_TiledRgbaOutputFile = (_func_int **)0x12c;
    out._outputFile = (TiledOutputFile *)0x190;
    out._toYa = (ToYa *)operator_new__(960000);
    lVar23 = 0;
    for (lVar18 = 0; lVar18 != 300; lVar18 = lVar18 + 1) {
      for (lVar24 = 0; lVar24 != 400; lVar24 = lVar24 + 1) {
        half::half(&local_8c,-1.0);
        half::half(&local_8e,-1.0);
        half::half(&local_90,-1.0);
        half::half(&local_92,-1.0);
        *(ulong *)((long)&((out._toYa)->super_Mutex).super___mutex_base._M_mutex +
                  lVar24 * 8 + (long)out._outputFile * lVar23) =
             CONCAT26(local_92._h,CONCAT24(local_90._h,CONCAT22(local_8e._h,local_8c._h)));
      }
      lVar23 = lVar23 + 8;
    }
    std::operator<<((ostream *)&std::cout,"reading multiple tiles at a time,");
    std::ostream::flush();
    _Var4 = fileName._M_dataplus;
    iVar9 = Imf_2_5::globalThreadCount();
    Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&header,_Var4._M_p,iVar9);
    pBVar14 = Imf_2_5::TiledRgbaInputFile::dataWindow((TiledRgbaInputFile *)&header);
    iVar9 = (pBVar14->min).x;
    if ((pBVar14->max).x - iVar9 != 399) {
      __assert_fail("dw.max.x - dw.min.x + 1 == width",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x261,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    iVar10 = (pBVar14->min).y;
    if ((pBVar14->max).y - iVar10 != 299) {
      __assert_fail("dw.max.y - dw.min.y + 1 == height",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x262,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (iVar9 != 0) {
      __assert_fail("dw.min.x == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x263,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (iVar10 != 0) {
      __assert_fail("dw.min.y == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x264,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    Imf_2_5::TiledRgbaInputFile::setFrameBuffer
              ((TiledRgbaInputFile *)&header,(Rgba *)out._toYa,1,400);
    iVar9 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
    if (0 < iVar9) break;
    poVar12 = std::operator<<((ostream *)&std::cout," comparing");
    std::endl<char,std::char_traits<char>>(poVar12);
    std::ostream::flush();
    pcVar22 = ((out._toYa)->super_Mutex).super___mutex_base._M_mutex.__size + 6;
    phVar17 = &(p1._data)->a;
    for (lVar23 = 0; lVar23 != 300; lVar23 = lVar23 + 1) {
      for (lVar18 = 0; lVar18 != 400; lVar18 = lVar18 + 1) {
        fVar2 = *(float *)((long)&half::_toFloat + (ulong)*(ushort *)(pcVar22 + lVar18 * 8 + -6) * 4
                          );
        if (((((fVar2 != -1.0) || (NAN(fVar2))) ||
             (fVar3 = *(float *)((long)&half::_toFloat +
                                (ulong)*(ushort *)(pcVar22 + lVar18 * 8 + -4) * 4), fVar3 != -1.0))
            || (((NAN(fVar3) ||
                 (fVar3 = *(float *)((long)&half::_toFloat +
                                    (ulong)*(ushort *)(pcVar22 + lVar18 * 8 + -2) * 4),
                 fVar3 != -1.0)) ||
                ((NAN(fVar3) ||
                 ((fVar3 = *(float *)((long)&half::_toFloat +
                                     (ulong)*(ushort *)(pcVar22 + lVar18 * 8) * 4), fVar3 != -1.0 ||
                  (NAN(fVar3))))))))) &&
           (((pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar17[lVar18 * 4 + -3]._h * 4),
             fVar2 != *pfVar1 ||
             ((((NAN(fVar2) || NAN(*pfVar1) ||
                (fVar2 = *(float *)((long)&half::_toFloat +
                                   (ulong)*(ushort *)(pcVar22 + lVar18 * 8 + -4) * 4),
                pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar17[lVar18 * 4 + -2]._h * 4),
                fVar2 != *pfVar1)) || (NAN(fVar2) || NAN(*pfVar1))) ||
              ((fVar2 = *(float *)((long)&half::_toFloat +
                                  (ulong)*(ushort *)(pcVar22 + lVar18 * 8 + -2) * 4),
               pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar17[lVar18 * 4 + -1]._h * 4),
               fVar2 != *pfVar1 || (NAN(fVar2) || NAN(*pfVar1))))))) ||
            ((fVar2 = *(float *)((long)&half::_toFloat +
                                (ulong)*(ushort *)(pcVar22 + lVar18 * 8) * 4),
             pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar17[lVar18 * 4]._h * 4),
             fVar2 != *pfVar1 || (NAN(fVar2) || NAN(*pfVar1))))))) {
          __assert_fail("(t.r == -1 && t.g == -1 && t.b == -1 && t.a == -1) || (t.r == s.r && t.g == s.g && t.b == s.b && t.a == s.a)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                        ,0x287,
                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
        }
      }
      pcVar22 = pcVar22 + (long)out._outputFile * 8;
      phVar17 = phVar17 + p1._sizeY * 4;
    }
    Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
    Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D((Array2D<Imf_2_5::Rgba> *)&out);
    remove(fileName._M_dataplus._M_p);
    Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D(&p1);
    std::__cxx11::string::~string((string *)&fileName);
    iVar8 = iVar8 + 1;
  }
  iVar8 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
  Imf_2_5::TiledRgbaInputFile::readTiles((TiledRgbaInputFile *)&header,0,iVar8 + -1,0,0,0);
  __assert_fail("tilesMissing || tilesBroken",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                ,0x27a,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
}

Assistant:

void
testTiledRgba (const std::string &tempDir)
{
    try
    {
        cout << "Testing the tiled RGBA image interface" << endl;

	int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads()? 3: 0;

	for (int n = 0; n <= maxThreads; ++n)
	{
	    if (ILMTHREAD_NAMESPACE::supportsThreads())
	    {
		setGlobalThreadCount (n);
		cout << "\nnumber of threads: " << globalThreadCount() << endl;
	    }

	    const int W[] = { 9, 69, 75, 80 };
	    const int H[] = { 7, 50, 52, 55 };

	    for (int i = 0; i < 4; ++i)
	    {
		cout << "\nImage size = " << W[i] << " x " << H[i] << endl;

		for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
		{
		    //
		    // for tiled files, ZIPS and ZIP are the same thing
		    //

		    if (comp == ZIP_COMPRESSION)
			comp++;

		    if (i == 0)
		    {
			//
			// for single-pixel tiles, we don't gain anything
			// by testing multiple image sizes (and singe-pixel
			// tiles are rather slow anyway)
			//

			writeRead (tempDir, W[i], H[i], Compression (comp), 1, 1);
		    }

		    writeRead (tempDir, W[i], H[i], Compression (comp), 35, 26);
		    writeRead (tempDir, W[i], H[i], Compression (comp), 75, 52);
		    writeRead (tempDir, W[i], H[i], Compression (comp), 264, 129);
		}
	    }

	    writeReadIncomplete (tempDir);
	}

	writeReadLayers (tempDir);

        cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
        cerr << "ERROR -- caught exception: " << e.what() << endl;
        assert (false);
    }
}